

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string.cpp
# Opt level: O2

bool __thiscall ON_CheckSum::IsSet(ON_CheckSum *this)

{
  undefined4 in_EAX;
  int iVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  
  auVar3._0_4_ = -(uint)(this->m_crc[0] == 0);
  auVar3._4_4_ = -(uint)(this->m_crc[1] == 0);
  auVar3._8_4_ = -(uint)(this->m_crc[2] == 0);
  auVar3._12_4_ = -(uint)(this->m_crc[3] == 0);
  iVar1 = movmskps(in_EAX,auVar3);
  bVar2 = true;
  if ((((iVar1 == 0xf) && ((this->m_crc[5] == 0 && this->m_crc[4] == 0) && this->m_crc[6] == 0)) &&
      (this->m_size == 0)) && (this->m_time == 0)) {
    bVar2 = this->m_crc[7] != 0;
  }
  return bVar2;
}

Assistant:

bool ON_CheckSum::IsSet() const
{
  return ( 0 != m_size 
           || 0 != m_time 
           || 0 != m_crc[0]
           || 0 != m_crc[1]
           || 0 != m_crc[2]
           || 0 != m_crc[3]
           || 0 != m_crc[4]
           || 0 != m_crc[5]
           || 0 != m_crc[6]
           || 0 != m_crc[7]
           );           
}